

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::abort(session_impl *this)

{
  io_context *ctx;
  element_type *peVar1;
  bool bVar2;
  reference this_00;
  __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar3;
  reference this_02;
  pointer this_03;
  polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
  *ppVar4;
  size_t sVar5;
  element_type *this_04;
  size_type sVar6;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *this_05;
  element_type *peVar7;
  element_type *this_06;
  element_type *this_07;
  int __fd;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  *__rhs;
  counters *this_08;
  error_handler_interface *in_R8;
  allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1119:36),_72UL,_(libtorrent::aux::HandlerName)4>
  local_138;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_120;
  shared_ptr<libtorrent::aux::listen_socket_t> *l;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2_3;
  error_code local_f8;
  element_type *local_e8;
  peer_connection *p;
  _Self local_d8;
  iterator i;
  shared_ptr<libtorrent::aux::torrent> *te;
  iterator __end2_2;
  iterator __begin2_2;
  torrent_list<libtorrent::aux::torrent> *__range2_2;
  unique_ptr<_3e2901aa_> *s;
  iterator __end2_1;
  iterator __begin2_1;
  type *__range2_1;
  type sockets;
  error_code ec;
  shared_ptr<libtorrent::plugin> *ext;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  session_impl *local_10;
  session_impl *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_10 = this;
    session_log(this," *** ABORT CALLED ***");
    ::std::function<void_()>::function((function<void_()> *)&__range2);
    alert_manager::set_notify_function(&this->m_alerts,(function<void_()> *)&__range2);
    ::std::function<void_()>::~function((function<void_()> *)&__range2);
    this_00 = ::std::
              array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
              ::operator[](&this->m_ses_extensions,0);
    __end2 = ::std::
             vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ::begin(this_00);
    ext = (shared_ptr<libtorrent::plugin> *)
          ::std::
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                       *)&ext), bVar2) {
      this_01 = (__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                 ::operator*(&__end2);
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      (*peVar3->_vptr_plugin[5])();
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
      ::operator++(&__end2);
    }
    resolver::abort(&this->m_host_resolver);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_close_file_timer);
    this->m_abort = true;
    boost::system::error_code::error_code
              ((error_code *)&sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_timer);
    i2p_connection::close(&this->m_i2p_conn,(int)&sockets + 0x28);
    stop_ip_notifier(this);
    stop_lsd(this);
    stop_upnp(this);
    stop_natpmp(this);
    stop_dht(this);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_dht_announce_timer);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_lsd_announce_timer);
    ::std::set<$8bc1ef71$>::set((set<_8bc1ef71_> *)&__range2_1,&this->m_incoming_sockets);
    __end2_1 = ::std::set<$8bc1ef71$>::begin((set<_8bc1ef71_> *)&__range2_1);
    s = (unique_ptr<_3e2901aa_> *)::std::set<$8bc1ef71$>::end((set<_8bc1ef71_> *)&__range2_1);
    while (bVar2 = ::std::operator!=(&__end2_1,(_Self *)&s), bVar2) {
      this_02 = ::std::_Rb_tree_const_iterator<$e17e35b3$>::operator*(&__end2_1);
      this_03 = ::std::unique_ptr<$3e2901aa$>::operator->(this_02);
      polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
      ::close(this_03,(int)&sockets + 0x28);
      ::std::_Rb_tree_const_iterator<$e17e35b3$>::operator++(&__end2_1);
    }
    ::std::set<$8bc1ef71$>::~set((set<_8bc1ef71_> *)&__range2_1);
    bVar2 = ::std::optional::operator_cast_to_bool((optional *)&this->m_i2p_listen_socket);
    if (bVar2) {
      ppVar4 = ::std::
               optional<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
               ::operator->(&this->m_i2p_listen_socket);
      bVar2 = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              ::is_open(ppVar4);
      if (bVar2) {
        ppVar4 = ::std::
                 optional<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
                 ::operator->(&this->m_i2p_listen_socket);
        polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
        ::close(ppVar4,(int)&sockets + 0x28);
      }
    }
    sVar5 = torrent_list<libtorrent::aux::torrent>::size(&this->m_torrents);
    session_log(this," aborting all torrents (%d)",sVar5 & 0xffffffff);
    __end2_2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    te = (shared_ptr<libtorrent::aux::torrent> *)
         torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                               *)&te), bVar2) {
      i._M_node = (_Base_ptr)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                  ::operator*(&__end2_2);
      this_04 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)i._M_node);
      torrent::abort(this_04);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end2_2);
    }
    torrent_list<libtorrent::aux::torrent>::clear(&this->m_torrents);
    this_08 = &this->m_stats_counters;
    counters::set_value(this_08,0xe9,0);
    counters::set_value(this_08,0xeb,0);
    counters::set_value(this_08,0xea,0);
    session_log(this," aborting all tracker requests");
    tracker_manager::stop(&this->m_tracker_manager);
    sVar6 = ::std::
            set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
            ::size(&this->m_connections);
    session_log(this," aborting all connections (%d)",sVar6 & 0xffffffff);
    local_d8._M_node =
         (_Base_ptr)
         ::std::
         set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
         ::begin(&this->m_connections);
    while( true ) {
      p = (peer_connection *)
          ::std::
          set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
          ::end(&this->m_connections);
      bVar2 = ::std::operator!=(&local_d8,(_Self *)&p);
      if (!bVar2) break;
      this_05 = &::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>
                 ::operator*(&local_d8)->
                 super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>;
      local_e8 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::
                 get(this_05);
      ::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>::operator++
                (&local_d8);
      peVar1 = local_e8;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_f8,stopping_torrent,(type *)0x0);
      (*(peVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(peVar1,&local_f8,1,0);
    }
    __end2_3 = ::std::
               vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               ::begin(&this->m_listen_sockets);
    l = (shared_ptr<libtorrent::aux::listen_socket_t> *)
        ::std::
        vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
        ::end(&this->m_listen_sockets);
    while( true ) {
      __rhs = (__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
               *)&l;
      bVar2 = __gnu_cxx::operator!=(&__end2_3,__rhs);
      __fd = (int)__rhs;
      if (!bVar2) break;
      local_120 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                     ::operator*(&__end2_3);
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_120);
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar7->sock);
      if (bVar2) {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_120);
        this_06 = ::std::
                  __shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar7->sock);
        __fd = (int)&sockets + 0x28;
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::close(this_06,__fd);
      }
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_120);
      bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar7->udp_sock);
      if (bVar2) {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_120);
        this_07 = ::std::
                  __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar7->udp_sock);
        udp_socket::close(&this_07->sock,__fd);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
      ::operator++(&__end2_3);
    }
    bVar2 = ::std::
            vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
            ::empty(&this->m_undead_peers);
    if (bVar2) {
      ctx = this->m_io_context;
      make_handler<libtorrent::aux::session_impl::abort()::__0,72ul,(libtorrent::aux::HandlerName)4>
                (&local_138,(aux *)this,
                 (anon_class_8_1_8991fb9c_for_handler)&this->m_abort_handler_storage,
                 (handler_storage<72UL,_(libtorrent::aux::HandlerName)4> *)
                 &this->super_error_handler_interface,in_R8);
      boost::asio::
      post<boost::asio::io_context,libtorrent::aux::allocating_handler<libtorrent::aux::session_impl::abort()::__0,72ul,(libtorrent::aux::HandlerName)4>>
                (ctx,&local_138,(type *)0x0);
    }
  }
  return;
}

Assistant:

void session_impl::abort() noexcept
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** ABORT CALLED ***");
#endif

		// at this point we cannot call the notify function anymore, since the
		// session will become invalid.
		m_alerts.set_notify_function({});

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->abort();
		}
#endif

		// this will cancel requests that are not critical for shutting down
		// cleanly. i.e. essentially tracker hostname lookups that we're not
		// about to send event=stopped to
		m_host_resolver.abort();

		m_close_file_timer.cancel();

		// abort the main thread
		m_abort = true;
		error_code ec;

		// we rely on on_tick() during shutdown, but we don't need to wait a
		// whole second for it to fire
		m_timer.cancel();

#if TORRENT_USE_I2P
		m_i2p_conn.close(ec);
#endif
		stop_ip_notifier();
		stop_lsd();
		stop_upnp();
		stop_natpmp();
#ifndef TORRENT_DISABLE_DHT
		stop_dht();
		m_dht_announce_timer.cancel();
#endif
		m_lsd_announce_timer.cancel();

#ifdef TORRENT_SSL_PEERS
		{
			auto const sockets = std::move(m_incoming_sockets);
			for (auto const& s : sockets)
			{
				s->close(ec);
				TORRENT_ASSERT(!ec);
			}
		}
#endif

#if TORRENT_USE_I2P
		if (m_i2p_listen_socket && m_i2p_listen_socket->is_open())
		{
			m_i2p_listen_socket->close(ec);
			TORRENT_ASSERT(!ec);
		}
#endif

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all torrents (%d)", int(m_torrents.size()));
#endif
		// abort all torrents
		for (auto const& te : m_torrents)
		{
			te->abort();
		}
		m_torrents.clear();
		m_stats_counters.set_value(counters::num_peers_up_unchoked_all, 0);
		m_stats_counters.set_value(counters::num_peers_up_unchoked, 0);
		m_stats_counters.set_value(counters::num_peers_up_unchoked_optimistic, 0);

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all tracker requests");
#endif
		m_tracker_manager.stop();

#ifndef TORRENT_DISABLE_LOGGING
		session_log(" aborting all connections (%d)", int(m_connections.size()));
#endif
		// abort all connections
		for (auto i = m_connections.begin(); i != m_connections.end();)
		{
			peer_connection* p = (*i).get();
			++i;
			p->disconnect(errors::stopping_torrent, operation_t::bittorrent);
		}

		// close the listen sockets
		for (auto const& l : m_listen_sockets)
		{
			if (l->sock)
			{
				l->sock->close(ec);
				TORRENT_ASSERT(!ec);
			}

			// TODO: 3 closing the udp sockets here means that
			// the uTP connections cannot be closed gracefully
			if (l->udp_sock)
			{
				l->udp_sock->sock.close();
			}
		}

		// we need to give all the sockets an opportunity to actually have their handlers
		// called and cancelled before we continue the shutdown. This is a bit
		// complicated, if there are no "undead" peers, it's safe to resume the
		// shutdown, but if there are, we have to wait for them to be cleared out
		// first. In session_impl::on_tick() we check them periodically. If we're
		// shutting down and we remove the last one, we'll initiate
		// shutdown_stage2 from there.
		if (m_undead_peers.empty())
		{
			post(m_io_context, make_handler([this] { abort_stage2(); }
				, m_abort_handler_storage, *this));
		}
	}